

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::ExpandLinkItems
          (cmGeneratorTarget *this,string *prop,cmBTStringRange entries,string *config,
          cmGeneratorTarget *headTarget,LinkInterfaceFor interfaceFor,LinkInterfaceField field,
          cmLinkInterface *iface)

{
  _Alloc_hider _Var1;
  pointer pcVar2;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pBVar3;
  pointer pbVar4;
  bool bVar5;
  string *psVar6;
  cmSourceFile *this_00;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  _Var7;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *this_01;
  pointer n;
  string_view arg;
  cmGeneratorExpression ge;
  LookupLinkItemScope scope;
  optional<cmLinkItem> maybeItem;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libs;
  cmGeneratorExpressionDAGChecker dagChecker;
  cmGeneratorExpression local_230;
  cmGeneratorTarget *local_220;
  undefined1 local_218 [32];
  cmGeneratorTarget *local_1f8;
  bool local_1f0;
  element_type *local_1e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1e0;
  string local_1d8;
  cmListFileBacktrace local_1b8;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *local_1a8;
  cmMakefile *local_1a0;
  string *local_198;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_190;
  string *local_188;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_180;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *local_178;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *local_170;
  long *local_168 [2];
  long local_158 [2];
  undefined1 local_148 [16];
  undefined1 local_138 [8];
  _Optional_payload_base<cmLinkItem> local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  string local_d0;
  cmGeneratorExpressionDAGChecker local_b0;
  
  local_190 = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)entries.End._M_current;
  _Var7 = entries.Begin._M_current;
  if (_Var7._M_current != local_190) {
    pcVar2 = (prop->_M_dataplus)._M_p;
    local_220 = headTarget;
    local_188 = config;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar2,pcVar2 + prop->_M_string_length);
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              (&local_b0,this,&local_d0,(GeneratorExpressionContent *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if (interfaceFor == Usage) {
      local_b0.TransitivePropertiesOnly = true;
    }
    local_138 = (undefined1  [8])this->LocalGenerator;
    local_1a0 = ((cmLocalGenerator *)local_138)->Makefile;
    local_198 = &local_220->LinkerLanguage;
    local_230.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._4_4_ = (LookupSelf)(field != Libraries);
    _Var1._M_p = (pointer)((long)&local_130._M_payload + 0x10);
    local_170 = &(iface->super_cmLinkInterfaceLibraries).HeadExclude;
    local_178 = &(iface->super_cmLinkInterfaceLibraries).HeadInclude;
    local_1a8 = &(iface->super_cmLinkInterfaceLibraries).Objects;
    do {
      local_1b8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = ((_Var7._M_current)->Backtrace).
                super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      local_1b8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           ((_Var7._M_current)->Backtrace).
           super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if (local_1b8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_1b8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_1b8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_1b8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_1b8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_148,&local_1b8);
      if (local_1b8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1b8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      pcVar2 = ((_Var7._M_current)->Value)._M_dataplus._M_p;
      local_168[0] = local_158;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_168,pcVar2,pcVar2 + ((_Var7._M_current)->Value)._M_string_length);
      cmGeneratorExpression::Parse(&local_230,(string *)local_148);
      if (local_168[0] != local_158) {
        operator_delete(local_168[0],local_158[0] + 1);
      }
      *(bool *)((long)local_230.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                      .TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr + 0x49) = true;
      local_180 = _Var7._M_current;
      psVar6 = cmCompiledGeneratorExpression::Evaluate
                         ((cmCompiledGeneratorExpression *)
                          local_230.Backtrace.
                          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,this->LocalGenerator,local_188,local_220,&local_b0,this,local_198)
      ;
      arg._M_str = (psVar6->_M_dataplus)._M_p;
      arg._M_len = psVar6->_M_string_length;
      cmExpandedList_abi_cxx11_(&local_e8,arg,false);
      pbVar4 = local_e8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (n = local_e8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; pBVar3 = local_180, n != pbVar4; n = n + 1
          ) {
        local_218._0_8_ =
             (((cmListFileBacktrace *)
              &(local_230.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->Value)->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>).
             TopEntry.
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
        local_218._8_8_ =
             (((cmListFileBacktrace *)
              &(local_230.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->Value)->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>).
             TopEntry.
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_)->_M_use_count + 1
            ;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_)->_M_use_count + 1
            ;
          }
        }
        LookupLinkItem((optional<cmLinkItem> *)&local_130,this,n,(cmListFileBacktrace *)local_218,
                       (LookupLinkItemScope *)local_138,
                       local_230.Backtrace.
                       super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi._4_4_);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_);
        }
        if (local_130._M_engaged == true) {
          if (local_130._M_payload._M_value.String._M_dataplus._M_p == (_Alloc_hider)_Var1._M_p) {
            local_218._24_8_ = local_130._M_payload._24_8_;
            local_218._0_8_ = (element_type *)(local_218 + 0x10);
          }
          else {
            local_218._0_8_ = local_130._M_payload._M_value.String._M_dataplus._M_p;
          }
          local_218._17_7_ = local_130._M_payload._17_7_;
          local_218[0x10] = local_130._M_payload._16_1_;
          local_218._8_8_ = local_130._M_payload._M_value.String._M_string_length;
          local_130._M_payload._M_value.String._M_string_length = 0;
          local_130._M_payload._16_1_ = 0;
          local_1f0 = local_130._M_payload._M_value.Cross;
          local_1f8 = local_130._M_payload._M_value.Target;
          local_1e8 = local_130._M_payload._M_value.Backtrace.
                      super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
          _Stack_1e0._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_130._M_payload._M_value.Backtrace.
               super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
          local_130._M_payload._M_value.Backtrace.
          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          local_130._M_payload._M_value.Backtrace.
          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi =
               (__shared_count<(__gnu_cxx::_Lock_policy)2>)
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this_01 = local_170;
          local_130._M_payload._M_value.String._M_dataplus._M_p = (_Alloc_hider)_Var1._M_p;
          if ((field == HeadExclude) || (this_01 = local_178, field == HeadInclude)) {
            std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::emplace_back<cmLinkItem>
                      (this_01,(cmLinkItem *)local_218);
          }
          else {
            if (local_130._M_payload._M_value.Target == (cmGeneratorTarget *)0x0) {
              psVar6 = cmLinkItem::AsStr_abi_cxx11_((cmLinkItem *)local_218);
              bVar5 = cmsys::SystemTools::FileIsFullPath(psVar6);
              if (bVar5) {
                this_00 = cmMakefile::GetSource(local_1a0,psVar6,Known);
                if (this_00 != (cmSourceFile *)0x0) {
                  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
                  local_1d8.field_2._8_7_ = 0x5443454a424f5f;
                  local_1d8.field_2._M_allocated_capacity._0_7_ = 0x414e5245545845;
                  local_1d8.field_2._M_local_buf[7] = 'L';
                  local_1d8._M_string_length = 0xf;
                  local_1d8.field_2._M_local_buf[0xf] = '\0';
                  bVar5 = cmSourceFile::GetPropertyAsBool(this_00,&local_1d8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                    operator_delete(local_1d8._M_dataplus._M_p,
                                    CONCAT17(local_1d8.field_2._M_local_buf[7],
                                             local_1d8.field_2._M_allocated_capacity._0_7_) + 1);
                  }
                  if (bVar5) {
                    std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::emplace_back<cmLinkItem>
                              (local_1a8,(cmLinkItem *)local_218);
                    goto LAB_003e4952;
                  }
                }
              }
            }
            std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::emplace_back<cmLinkItem>
                      ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)iface,
                       (cmLinkItem *)local_218);
          }
LAB_003e4952:
          if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1e0._M_pi);
          }
          if ((element_type *)local_218._0_8_ != (element_type *)(local_218 + 0x10)) {
            operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
          }
        }
        if (local_130._M_engaged == true) {
          std::_Optional_payload_base<cmLinkItem>::_M_destroy(&local_130);
        }
      }
      if (*(bool *)((long)local_230.Backtrace.
                          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + 0x131) != false) {
        (iface->super_cmLinkInterfaceLibraries).HadHeadSensitiveCondition = true;
      }
      if (*(bool *)((long)local_230.Backtrace.
                          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + 0x130) == true) {
        (iface->super_cmLinkInterfaceLibraries).HadContextSensitiveCondition = true;
      }
      if (*(bool *)((long)local_230.Backtrace.
                          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + 0x132) == true) {
        iface->HadLinkLanguageSensitiveCondition = true;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_e8);
      std::
      unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
      ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                     *)&local_230);
      cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_148);
      _Var7._M_current = pBVar3 + 1;
    } while (_Var7._M_current != local_190);
    if (local_b0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                 TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    std::
    _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&local_b0.Seen._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.Property._M_dataplus._M_p != &local_b0.Property.field_2) {
      operator_delete(local_b0.Property._M_dataplus._M_p,
                      local_b0.Property.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmGeneratorTarget::ExpandLinkItems(
  std::string const& prop, cmBTStringRange entries, std::string const& config,
  cmGeneratorTarget const* headTarget, LinkInterfaceFor interfaceFor,
  LinkInterfaceField field, cmLinkInterface& iface) const
{
  if (entries.empty()) {
    return;
  }
  // Keep this logic in sync with ComputeLinkImplementationLibraries.
  cmGeneratorExpressionDAGChecker dagChecker(this, prop, nullptr, nullptr);
  // The $<LINK_ONLY> expression may be in a link interface to specify
  // private link dependencies that are otherwise excluded from usage
  // requirements.
  if (interfaceFor == LinkInterfaceFor::Usage) {
    dagChecker.SetTransitivePropertiesOnly();
  }
  cmMakefile const* mf = this->LocalGenerator->GetMakefile();
  LookupLinkItemScope scope{ this->LocalGenerator };
  for (BT<std::string> const& entry : entries) {
    cmGeneratorExpression ge(entry.Backtrace);
    std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(entry.Value);
    cge->SetEvaluateForBuildsystem(true);
    std::vector<std::string> libs = cmExpandedList(
      cge->Evaluate(this->LocalGenerator, config, headTarget, &dagChecker,
                    this, headTarget->LinkerLanguage));
    for (std::string const& lib : libs) {
      if (cm::optional<cmLinkItem> maybeItem = this->LookupLinkItem(
            lib, cge->GetBacktrace(), &scope,
            field == LinkInterfaceField::Libraries ? LookupSelf::No
                                                   : LookupSelf::Yes)) {
        cmLinkItem item = std::move(*maybeItem);

        if (field == LinkInterfaceField::HeadInclude) {
          iface.HeadInclude.emplace_back(std::move(item));
          continue;
        }
        if (field == LinkInterfaceField::HeadExclude) {
          iface.HeadExclude.emplace_back(std::move(item));
          continue;
        }
        if (!item.Target) {
          // Report explicitly linked object files separately.
          std::string const& maybeObj = item.AsStr();
          if (cmSystemTools::FileIsFullPath(maybeObj)) {
            cmSourceFile const* sf =
              mf->GetSource(maybeObj, cmSourceFileLocationKind::Known);
            if (sf && sf->GetPropertyAsBool("EXTERNAL_OBJECT")) {
              iface.Objects.emplace_back(std::move(item));
              continue;
            }
          }
        }

        iface.Libraries.emplace_back(std::move(item));
      }
    }
    if (cge->GetHadHeadSensitiveCondition()) {
      iface.HadHeadSensitiveCondition = true;
    }
    if (cge->GetHadContextSensitiveCondition()) {
      iface.HadContextSensitiveCondition = true;
    }
    if (cge->GetHadLinkLanguageSensitiveCondition()) {
      iface.HadLinkLanguageSensitiveCondition = true;
    }
  }
}